

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnViewPrivate::QColumnViewPrivate(QColumnViewPrivate *this)

{
  QAbstractItemViewPrivate *in_RDI;
  
  QAbstractItemViewPrivate::QAbstractItemViewPrivate(in_RDI);
  *(undefined ***)
   &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate =
       &PTR__QColumnViewPrivate_00d2dce8;
  QList<QAbstractItemView_*>::QList((QList<QAbstractItemView_*> *)0x865f0b);
  QList<int>::QList((QList<int> *)0x865f1c);
  in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x30 = 1
  ;
  *(undefined4 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x34 =
       0;
  QPropertyAnimation::QPropertyAnimation
            ((QPropertyAnimation *)
             &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
              field_0x38,(QObject *)0x0);
  QMetaObject::Connection::Connection
            ((Connection *)
             &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
              field_0x48);
  std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::vector
            ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)0x865f64);
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  ::QHash((QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
           *)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
              field_0x68);
  *(undefined8 *)
   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x70 =
       0;
  in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.extra._M_t.
  super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
  super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
  super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl = (QWExtra *)0x0;
  return;
}

Assistant:

QColumnViewPrivate::QColumnViewPrivate()
:  QAbstractItemViewPrivate()
,showResizeGrips(true)
,offset(0)
,previewWidget(nullptr)
,previewColumn(nullptr)
{
}